

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Value __thiscall Catch::RunContext::actOnCurrentResult(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  uint uVar2;
  Value local_1c;
  Value action;
  AssertionResult *result_local;
  RunContext *this_local;
  
  AssertionResult::operator=(&this->m_lastResult,result);
  (*(this->super_IResultCapture)._vptr_IResultCapture[2])(this,&this->m_lastResult);
  local_1c = None;
  bVar1 = AssertionResult::isOk(&this->m_lastResult);
  if (!bVar1) {
    local_1c = Failed;
    uVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[7])();
    if ((uVar2 & 1) != 0) {
      local_1c = Debug|Failed;
    }
    bVar1 = aborting(this);
    if (bVar1) {
      local_1c = local_1c | Abort;
    }
  }
  return local_1c;
}

Assistant:

ResultAction::Value actOnCurrentResult( AssertionResult const& result ) {
            m_lastResult = result;
            assertionEnded( m_lastResult );

            ResultAction::Value action = ResultAction::None;

            if( !m_lastResult.isOk() ) {
                action = ResultAction::Failed;
                if( shouldDebugBreak() )
                    action = (ResultAction::Value)( action | ResultAction::Debug );
                if( aborting() )
                    action = (ResultAction::Value)( action | ResultAction::Abort );
            }
            return action;
        }